

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O1

void __thiscall
Function_Pool::AreaInfo::_fill
          (AreaInfo *this,uint32_t x,uint32_t y,uint32_t width_,uint32_t height_,uint32_t count,
          bool yAxis)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  ulong uVar4;
  ulong __new_size;
  long lVar5;
  uint __tmp;
  uint __tmp_2;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  uint __tmp_1;
  
  __new_size = (ulong)count;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->startX,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->startY,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->width,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->height,__new_size);
  if (yAxis) {
    puVar1 = (this->startX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->startX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      auVar6 = vpbroadcastq_avx512f();
      auVar6 = vpsrlq_avx512f(auVar6,2);
      auVar7 = vpbroadcastd_avx512f();
      uVar4 = 0;
      auVar8 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar10 = vpbroadcastq_avx512f();
        auVar11 = vporq_avx512f(auVar10,auVar8);
        auVar10 = vporq_avx512f(auVar10,auVar9);
        vpcmpuq_avx512f(auVar10,auVar6,2);
        vpcmpuq_avx512f(auVar11,auVar6,2);
        auVar10 = vmovdqu32_avx512f(auVar7);
        *(undefined1 (*) [64])(puVar1 + uVar4) = auVar10;
        uVar4 = uVar4 + 0x10;
      } while ((((ulong)((long)puVar2 + (-4 - (long)puVar1)) >> 2) + 0x10 & 0x7ffffffffffffff0) !=
               uVar4);
    }
    puVar1 = (this->width).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->width).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      auVar6 = vpbroadcastq_avx512f();
      auVar6 = vpsrlq_avx512f(auVar6,2);
      auVar7 = vpbroadcastd_avx512f();
      uVar4 = 0;
      auVar8 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar10 = vpbroadcastq_avx512f();
        auVar11 = vporq_avx512f(auVar10,auVar8);
        auVar10 = vporq_avx512f(auVar10,auVar9);
        vpcmpuq_avx512f(auVar10,auVar6,2);
        vpcmpuq_avx512f(auVar11,auVar6,2);
        auVar10 = vmovdqu32_avx512f(auVar7);
        *(undefined1 (*) [64])(puVar1 + uVar4) = auVar10;
        uVar4 = uVar4 + 0x10;
      } while ((((ulong)((long)puVar2 + (-4 - (long)puVar1)) >> 2) + 0x10 & 0x7ffffffffffffff0) !=
               uVar4);
    }
    uVar4 = (ulong)height_ % (ulong)count;
    puVar1 = (this->height).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->startY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      iVar3 = (int)uVar4;
      uVar4 = (ulong)(iVar3 - 1);
      if (iVar3 == 0) {
        uVar4 = 0;
      }
      puVar1[lVar5] = (height_ / count + 1) - (uint)(iVar3 == 0);
      puVar2[lVar5] = y;
      y = y + puVar1[lVar5];
      lVar5 = lVar5 + 1;
    } while (__new_size + (__new_size == 0) != lVar5);
  }
  else {
    puVar1 = (this->startY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->startY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      auVar6 = vpbroadcastq_avx512f();
      auVar6 = vpsrlq_avx512f(auVar6,2);
      auVar7 = vpbroadcastd_avx512f();
      uVar4 = 0;
      auVar8 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar10 = vpbroadcastq_avx512f();
        auVar11 = vporq_avx512f(auVar10,auVar8);
        auVar10 = vporq_avx512f(auVar10,auVar9);
        vpcmpuq_avx512f(auVar10,auVar6,2);
        vpcmpuq_avx512f(auVar11,auVar6,2);
        auVar10 = vmovdqu32_avx512f(auVar7);
        *(undefined1 (*) [64])(puVar1 + uVar4) = auVar10;
        uVar4 = uVar4 + 0x10;
      } while ((((ulong)((long)puVar2 + (-4 - (long)puVar1)) >> 2) + 0x10 & 0x7ffffffffffffff0) !=
               uVar4);
    }
    puVar1 = (this->height).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->height).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      auVar6 = vpbroadcastq_avx512f();
      auVar6 = vpsrlq_avx512f(auVar6,2);
      auVar7 = vpbroadcastd_avx512f();
      uVar4 = 0;
      auVar8 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar10 = vpbroadcastq_avx512f();
        auVar11 = vporq_avx512f(auVar10,auVar8);
        auVar10 = vporq_avx512f(auVar10,auVar9);
        vpcmpuq_avx512f(auVar10,auVar6,2);
        vpcmpuq_avx512f(auVar11,auVar6,2);
        auVar10 = vmovdqu32_avx512f(auVar7);
        *(undefined1 (*) [64])(puVar1 + uVar4) = auVar10;
        uVar4 = uVar4 + 0x10;
      } while ((((ulong)((long)puVar2 + (-4 - (long)puVar1)) >> 2) + 0x10 & 0x7ffffffffffffff0) !=
               uVar4);
    }
    uVar4 = (ulong)width_ % (ulong)count;
    puVar1 = (this->startX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->width).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      iVar3 = (int)uVar4;
      uVar4 = (ulong)(iVar3 - 1);
      if (iVar3 == 0) {
        uVar4 = 0;
      }
      puVar2[lVar5] = (width_ / count + 1) - (uint)(iVar3 == 0);
      puVar1[lVar5] = x;
      x = x + puVar2[lVar5];
      lVar5 = lVar5 + 1;
    } while (__new_size + (__new_size == 0) != lVar5);
  }
  return;
}

Assistant:

void AreaInfo::_fill( uint32_t x, uint32_t y, uint32_t width_, uint32_t height_, uint32_t count, bool yAxis )
    {
        startX.resize( count );
        startY.resize( count );
        width.resize( count );
        height.resize( count );

        if( yAxis ) { // process by rows
            std::fill( startX.begin(), startX.end(), x );
            std::fill( width.begin(), width.end(), width_ );

            uint32_t remainValue = height_ % count;
            uint32_t previousValue = y;

            for( size_t i = 0; i < count; ++i ) {
                height[i] = height_ / count;
                if( remainValue > 0 ) {
                    --remainValue;
                    ++height[i];
                }
                startY[i] = previousValue;
                previousValue = startY[i] + height[i];
            }
        }
        else { // process by columns
            std::fill( startY.begin(), startY.end(), y );
            std::fill( height.begin(), height.end(), height_ );

            uint32_t remainValue = width_ % count;
            uint32_t previousValue = x;

            for( size_t i = 0; i < count; ++i ) {
                width[i] = width_ / count;
                if( remainValue > 0 ) {
                    --remainValue;
                    ++width[i];
                }
                startX[i] = previousValue;
                previousValue = startX[i] + width[i];
            }
        }
    }